

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum2.pb.cc
# Opt level: O2

void __thiscall proto2_preserve_unknown_enum_unittest::MyMessage::~MyMessage(MyMessage *this)

{
  ~MyMessage(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

MyMessage::~MyMessage() {
  // @@protoc_insertion_point(destructor:proto2_preserve_unknown_enum_unittest.MyMessage)
  SharedDtor(*this);
}